

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_class_closure(Omega_h *this,Mesh *mesh,Int ent_dim,Int class_dim,ClassId class_id)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<signed_char> local_58;
  undefined4 local_48;
  undefined1 local_38 [8];
  Read<signed_char> eq_marks;
  ClassId class_id_local;
  Int class_dim_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  
  eq_marks.write_.shared_alloc_.direct_ptr._4_4_ = class_id;
  if (ent_dim <= class_dim) {
    mark_by_class((Omega_h *)local_38,mesh,class_dim,class_dim,class_id);
    if (ent_dim == class_dim) {
      Read<signed_char>::Read((Read<signed_char> *)this,(Read<signed_char> *)local_38);
    }
    else {
      Read<signed_char>::Read(&local_58,(Read<signed_char> *)local_38);
      mark_down(this,mesh,class_dim,ent_dim,&local_58);
      Read<signed_char>::~Read(&local_58);
    }
    local_48 = 1;
    Read<signed_char>::~Read((Read<signed_char> *)local_38);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","ent_dim <= class_dim",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,0x68);
}

Assistant:

Read<I8> mark_class_closure(
    Mesh* mesh, Int ent_dim, Int class_dim, ClassId class_id) {
  OMEGA_H_CHECK(ent_dim <= class_dim);
  auto eq_marks = mark_by_class(mesh, class_dim, class_dim, class_id);
  if (ent_dim == class_dim) return eq_marks;
  return mark_down(mesh, class_dim, ent_dim, eq_marks);
}